

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.h
# Opt level: O0

void __thiscall
spvtools::opt::InstructionFolder::InstructionFolder(InstructionFolder *this,IRContext *context)

{
  ConstantFoldingRules *this_00;
  FoldingRules *this_01;
  pointer pFVar1;
  pointer pCVar2;
  IRContext *context_local;
  InstructionFolder *this_local;
  
  this->context_ = context;
  this_00 = (ConstantFoldingRules *)::operator_new(0x90);
  ConstantFoldingRules::ConstantFoldingRules(this_00,context);
  std::
  unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
  ::unique_ptr<std::default_delete<spvtools::opt::ConstantFoldingRules>,void>
            ((unique_ptr<spvtools::opt::ConstantFoldingRules,std::default_delete<spvtools::opt::ConstantFoldingRules>>
              *)&this->const_folding_rules_,this_00);
  this_01 = (FoldingRules *)::operator_new(0x90);
  FoldingRules::FoldingRules(this_01,context);
  std::unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>::
  unique_ptr<std::default_delete<spvtools::opt::FoldingRules>,void>
            ((unique_ptr<spvtools::opt::FoldingRules,std::default_delete<spvtools::opt::FoldingRules>>
              *)&this->folding_rules_,this_01);
  pFVar1 = std::
           unique_ptr<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
           ::operator->(&this->folding_rules_);
  (*pFVar1->_vptr_FoldingRules[2])();
  pCVar2 = std::
           unique_ptr<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
           ::operator->(&this->const_folding_rules_);
  (*pCVar2->_vptr_ConstantFoldingRules[2])();
  return;
}

Assistant:

explicit InstructionFolder(IRContext* context)
      : context_(context),
        const_folding_rules_(new ConstantFoldingRules(context)),
        folding_rules_(new FoldingRules(context)) {
    folding_rules_->AddFoldingRules();
    const_folding_rules_->AddFoldingRules();
  }